

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.h
# Opt level: O0

StringVector * __thiscall
CoreML::Specification::GLMClassifier::mutable_stringclasslabels(GLMClassifier *this)

{
  bool bVar1;
  StringVector *this_00;
  GLMClassifier *this_local;
  
  bVar1 = has_stringclasslabels(this);
  if (!bVar1) {
    clear_ClassLabels(this);
    set_has_stringclasslabels(this);
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->ClassLabels_).stringclasslabels_ = this_00;
  }
  return (this->ClassLabels_).stringclasslabels_;
}

Assistant:

inline ::CoreML::Specification::StringVector* GLMClassifier::mutable_stringclasslabels() {
  if (!has_stringclasslabels()) {
    clear_ClassLabels();
    set_has_stringclasslabels();
    ClassLabels_.stringclasslabels_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.GLMClassifier.stringClassLabels)
  return ClassLabels_.stringclasslabels_;
}